

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBatchedMatmulLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  NeuralNetworkLayer *layer_00;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  Tensor *pTVar5;
  int *__b;
  uint32_t *puVar6;
  string *psVar7;
  BatchedMatMulLayerParams *pBVar8;
  WeightParams *pWVar9;
  WeightParams *bias;
  BatchedMatMulLayerParams *params;
  string local_180;
  byte local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  string err_3;
  undefined1 local_f8 [8];
  string err_2;
  undefined1 local_b8 [8];
  string err_1;
  int out_rank_1;
  int in_rank;
  undefined1 local_70 [8];
  string err;
  uint32_t local_44;
  int out_rank;
  int in2_rank;
  int in1_rank;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,1,2);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    local_21 = 1;
  }
  in1_rank = (int)!bVar2;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (in1_rank == 0) {
    in2_rank._3_1_ = 0;
    validateOutputCount(__return_storage_ptr__,local_20,1,1);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      in2_rank._3_1_ = 1;
    }
    in1_rank = (int)!bVar2;
    if ((in2_rank._3_1_ & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    if (in1_rank == 0) {
      iVar3 = Specification::NeuralNetworkLayer::input_size(local_20);
      if (((iVar3 == 2) &&
          (iVar3 = Specification::NeuralNetworkLayer::inputtensor_size(local_20), iVar3 == 2)) &&
         (iVar3 = Specification::NeuralNetworkLayer::outputtensor_size(local_20), iVar3 == 1)) {
        pTVar5 = Specification::NeuralNetworkLayer::inputtensor(local_20,0);
        out_rank = Specification::Tensor::rank(pTVar5);
        pTVar5 = Specification::NeuralNetworkLayer::inputtensor(local_20,1);
        local_44 = Specification::Tensor::rank(pTVar5);
        pTVar5 = Specification::NeuralNetworkLayer::outputtensor(local_20,0);
        uVar4 = Specification::Tensor::rank(pTVar5);
        err.field_2._12_4_ = 2;
        __b = std::max<int>(&out_rank,(int *)&local_44);
        puVar6 = (uint32_t *)std::max<int>((int *)(err.field_2._M_local_buf + 0xc),__b);
        if (uVar4 != *puVar6) {
          psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &out_rank_1,"BatchedMatMul layer \'",psVar7);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&out_rank_1,
                         "\': given ranks of the two inputs, rank of the output is incorrect.");
          std::__cxx11::string::~string((string *)&out_rank_1);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_70);
          in1_rank = 1;
          std::__cxx11::string::~string((string *)local_70);
          return __return_storage_ptr__;
        }
      }
      iVar3 = Specification::NeuralNetworkLayer::input_size(local_20);
      if (((iVar3 == 1) &&
          (iVar3 = Specification::NeuralNetworkLayer::inputtensor_size(local_20), iVar3 == 1)) &&
         (iVar3 = Specification::NeuralNetworkLayer::outputtensor_size(local_20), iVar3 == 1)) {
        pTVar5 = Specification::NeuralNetworkLayer::inputtensor(local_20,0);
        err_1.field_2._12_4_ = Specification::Tensor::rank(pTVar5);
        pTVar5 = Specification::NeuralNetworkLayer::outputtensor(local_20,0);
        err_1.field_2._8_4_ = Specification::Tensor::rank(pTVar5);
        if (err_1.field_2._8_4_ != err_1.field_2._12_4_) {
          psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
          pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&err_2.field_2 + 8);
          std::operator+(pbVar1,"BatchedMatMul layer \'",psVar7);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8,pbVar1,
                         "\': has one input, in this case, output and input ranks must be equal but they are not."
                        );
          std::__cxx11::string::~string((string *)(err_2.field_2._M_local_buf + 8));
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_b8);
          in1_rank = 1;
          std::__cxx11::string::~string((string *)local_b8);
          return __return_storage_ptr__;
        }
      }
      iVar3 = Specification::NeuralNetworkLayer::input_size(local_20);
      if (1 < iVar3) {
        pBVar8 = Specification::NeuralNetworkLayer::batchedmatmul(local_20);
        bVar2 = Specification::BatchedMatMulLayerParams::hasbias(pBVar8);
        if (bVar2) {
          psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
          pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&err_3.field_2 + 8);
          std::operator+(pbVar1,"BatchedMatMul layer \'",psVar7);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f8,pbVar1,
                         "\': has two inputs and \'hasBias\' flag is set to True.However, bias is only supported when the layer has 1 input."
                        );
          std::__cxx11::string::~string((string *)(err_3.field_2._M_local_buf + 8));
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_f8);
          in1_rank = 1;
          std::__cxx11::string::~string((string *)local_f8);
          return __return_storage_ptr__;
        }
      }
      iVar3 = Specification::NeuralNetworkLayer::input_size(local_20);
      if (1 < iVar3) {
        pBVar8 = Specification::NeuralNetworkLayer::batchedmatmul(local_20);
        bVar2 = Specification::BatchedMatMulLayerParams::int8dynamicquantize(pBVar8);
        if (bVar2) {
          psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
          std::operator+(&local_158,"BatchedMatMul layer \'",psVar7);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138,&local_158,"\': cannot use dynamic quantization with 2 inputs.");
          std::__cxx11::string::~string((string *)&local_158);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_138);
          in1_rank = 1;
          std::__cxx11::string::~string((string *)local_138);
          return __return_storage_ptr__;
        }
      }
      pBVar8 = Specification::NeuralNetworkLayer::batchedmatmul(local_20);
      bVar2 = Specification::BatchedMatMulLayerParams::int8dynamicquantize(pBVar8);
      if (bVar2) {
        local_159 = 0;
        pBVar8 = Specification::NeuralNetworkLayer::batchedmatmul(local_20);
        pWVar9 = Specification::BatchedMatMulLayerParams::weights(pBVar8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"BatchedMatMul",(allocator<char> *)((long)&params + 7));
        psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
        validateInt8Requirements(__return_storage_ptr__,pWVar9,&local_180,psVar7);
        std::__cxx11::string::~string((string *)&local_180);
        std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_159 = 1;
        }
        in1_rank = (int)!bVar2;
        if ((local_159 & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (in1_rank != 0) {
          return __return_storage_ptr__;
        }
      }
      iVar3 = Specification::NeuralNetworkLayer::input_size(local_20);
      if (iVar3 == 1) {
        pBVar8 = Specification::NeuralNetworkLayer::batchedmatmul(local_20);
        layer_00 = local_20;
        pWVar9 = Specification::BatchedMatMulLayerParams::weights(pBVar8);
        bias = Specification::BatchedMatMulLayerParams::bias(pBVar8);
        validateInnerProductWeightsBias(__return_storage_ptr__,layer_00,pWVar9,bias);
        bVar2 = Result::good(__return_storage_ptr__);
        in1_rank = (int)!bVar2;
        if (bVar2) {
          Result::~Result(__return_storage_ptr__);
        }
        if (in1_rank != 0) {
          return __return_storage_ptr__;
        }
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBatchedMatmulLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    // validate rank, if present
    if (layer.input_size() == 2 && layer.inputtensor_size() == 2 && layer.outputtensor_size() == 1) {
        int in1_rank = static_cast<int>(layer.inputtensor(0).rank());
        int in2_rank = static_cast<int>(layer.inputtensor(1).rank());
        int out_rank = static_cast<int>(layer.outputtensor(0).rank());
        if (out_rank != std::max(2, std::max(in1_rank, in2_rank))) {
            std::string err = "BatchedMatMul layer '" + layer.name() + "': given ranks of the two inputs, rank of the output is incorrect.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    if (layer.input_size() == 1 && layer.inputtensor_size() == 1 && layer.outputtensor_size() == 1) {
        int in_rank = static_cast<int>(layer.inputtensor(0).rank());
        int out_rank = static_cast<int>(layer.outputtensor(0).rank());
        if (out_rank != in_rank) {
            std::string err = "BatchedMatMul layer '" + layer.name() + "': has one input, in this case, output and input ranks must be equal but they are not.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    if (layer.input_size() > 1 && layer.batchedmatmul().hasbias()) {
        std::string err = "BatchedMatMul layer '" + layer.name() + "': has two inputs and 'hasBias' flag is set to True."
                                "However, bias is only supported when the layer has 1 input.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.input_size() > 1 && layer.batchedmatmul().int8dynamicquantize()) {
        std::string err = "BatchedMatMul layer '" + layer.name() + "': cannot use dynamic quantization with 2 inputs.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.batchedmatmul().int8dynamicquantize()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInt8Requirements(layer.batchedmatmul().weights(), "BatchedMatMul", layer.name()));
    }

    if (layer.input_size() == 1) {
        const auto& params = layer.batchedmatmul();
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInnerProductWeightsBias(layer, params.weights(), params.bias()));
    }

    return Result();
}